

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  char *pcVar1;
  short *psVar2;
  byte bVar3;
  U16 UVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  byte *pbVar26;
  ulong uVar27;
  bool bVar28;
  U16 valPerRank [13];
  U16 nbPerRank [13];
  unkbyte10 Stack_158;
  undefined6 local_14e;
  unkbyte10 Stack_148;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined1 uStack_130;
  undefined1 uStack_12f;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  undefined1 uStack_12c;
  undefined1 uStack_12b;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  undefined1 uStack_128;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  undefined1 uStack_124;
  undefined1 uStack_123;
  undefined1 uStack_122;
  undefined1 uStack_121;
  undefined1 uStack_120;
  undefined1 uStack_11f;
  undefined1 uStack_11e;
  undefined1 uStack_11d;
  undefined1 uStack_11c;
  undefined1 uStack_11b;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  sVar11 = 0xffffffffffffffff;
  if ((((ulong)workSpace & 3) == 0) && (sVar11 = 0xffffffffffffffbe, 0xfff < wkspSize)) {
    uVar8 = 0xb;
    if (maxNbBits != 0) {
      uVar8 = maxNbBits;
    }
    sVar11 = 0xffffffffffffffd2;
    if (maxSymbolValue < 0x100) {
      uVar16 = 0;
      memset(workSpace,0,0x1000);
      local_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      local_78 = 0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      local_98 = 0;
      uStack_90 = 0;
      uStack_88 = 0;
      uStack_80 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      uStack_c0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      local_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      uStack_100 = 0;
      local_138._0_1_ = 0;
      local_138._1_1_ = 0;
      local_138._2_1_ = 0;
      local_138._3_1_ = 0;
      uStack_134._0_1_ = 0;
      uStack_134._1_1_ = 0;
      uStack_134._2_1_ = 0;
      uStack_134._3_1_ = 0;
      uStack_130 = 0;
      uStack_12f = 0;
      uStack_12e = 0;
      uStack_12d = 0;
      uStack_12c = 0;
      uStack_12b = 0;
      uStack_12a = 0;
      uStack_129 = 0;
      uStack_128 = 0;
      uStack_127 = 0;
      uStack_126 = 0;
      uStack_125 = 0;
      uStack_124 = 0;
      uStack_123 = 0;
      uStack_122 = 0;
      uStack_121 = 0;
      uStack_120 = 0;
      uStack_11f = 0;
      uStack_11e = 0;
      uStack_11d = 0;
      uStack_11c = 0;
      uStack_11b = 0;
      uStack_11a = 0;
      uStack_119 = 0;
      uVar14 = (ulong)(maxSymbolValue + 1);
      do {
        uVar9 = count[uVar16] + 1;
        if (uVar9 == 0) goto LAB_0011093c;
        uVar18 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        (&local_138)[(ulong)uVar18 * 2] = (&local_138)[(ulong)uVar18 * 2] + 1;
        uVar16 = uVar16 + 1;
      } while (uVar14 != uVar16);
      lVar10 = 0x1d;
      do {
        (&local_138)[lVar10 * 2] = (&local_138)[lVar10 * 2] + *(int *)(&uStack_130 + lVar10 * 8);
        bVar28 = lVar10 != 0;
        lVar10 = lVar10 + -1;
      } while (bVar28);
      lVar10 = 0;
      do {
        (&uStack_134)[lVar10 * 2] = (&local_138)[lVar10 * 2];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      uVar16 = 0;
      do {
        uVar9 = count[uVar16];
        uVar18 = uVar9 + 1;
        if (uVar18 == 0) {
LAB_0011093c:
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5a1,"unsigned int BIT_highbit32(U32)");
        }
        uVar19 = 0x1f;
        if (uVar18 != 0) {
          for (; uVar18 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        uVar22 = (ulong)((uVar19 ^ 0x1fffffe0) * 8 + 0x108);
        uVar18 = *(uint *)((long)&local_138 + uVar22);
        uVar19 = *(uint *)((long)&uStack_134 + uVar22);
        uVar27 = (ulong)uVar19;
        *(uint *)((long)&uStack_134 + uVar22) = uVar19 + 1;
        uVar22 = uVar27;
        if (uVar18 < uVar19) {
          do {
            uVar22 = uVar22 - 1;
            if (uVar9 <= *(uint *)((long)workSpace + (uVar22 & 0xffffffff) * 8 + 8))
            goto LAB_001104a0;
            *(undefined8 *)((long)workSpace + uVar22 * 8 + 0x10) =
                 *(undefined8 *)((long)workSpace + (uVar22 & 0xffffffff) * 8 + 8);
            uVar19 = (int)uVar27 - 1;
            uVar27 = (ulong)uVar19;
          } while (uVar18 < uVar19);
          uVar27 = (ulong)uVar18;
        }
LAB_001104a0:
        *(uint *)((long)workSpace + uVar27 * 8 + 8) = uVar9;
        *(char *)((long)workSpace + uVar27 * 8 + 0xe) = (char)uVar16;
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar14);
      uVar9 = maxSymbolValue - 1;
      do {
        uVar18 = uVar9;
        uVar16 = (ulong)(uVar18 + 1);
        uVar9 = uVar18 - 1;
      } while (*(int *)((long)workSpace + uVar16 * 8 + 8) == 0);
      uVar19 = uVar18 + 1;
      lVar10 = (long)(int)uVar19;
      *(int *)((long)workSpace + 0x808) =
           *(int *)((long)workSpace + lVar10 * 8) + *(int *)((long)workSpace + lVar10 * 8 + 8);
      *(undefined2 *)((long)workSpace + lVar10 * 8 + 4) = 0x100;
      *(undefined2 *)((long)workSpace + lVar10 * 8 + 0xc) = 0x100;
      uVar13 = uVar18 + 0x100;
      if (uVar9 < 0xfffffeff) {
        uVar22 = 0x100;
        do {
          *(undefined4 *)((long)workSpace + uVar22 * 8 + 0x10) = 0x40000000;
          uVar22 = uVar22 + 1;
        } while (uVar22 < uVar13);
      }
      *(undefined4 *)workSpace = 0x80000000;
      if (0x100 < uVar13) {
        uVar25 = 0x100;
        uVar17 = 0x101;
        uVar20 = uVar9;
        do {
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar20 * 8 + 8);
          uVar6 = *(uint *)((long)workSpace + (long)(int)uVar25 * 8 + 8);
          uVar15 = (uVar25 + 1) - (uint)(uVar5 < uVar6);
          uVar7 = uVar25;
          if (uVar5 < uVar6) {
            uVar7 = uVar20;
          }
          uVar25 = (uint)(uVar5 < uVar6);
          uVar24 = uVar20 - uVar25;
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar24 * 8 + 8);
          uVar6 = *(uint *)((long)workSpace + (long)(int)uVar15 * 8 + 8);
          uVar20 = (uVar20 - uVar25) - (uint)(uVar5 < uVar6);
          uVar25 = (uVar15 + 1) - (uint)(uVar5 < uVar6);
          if (uVar6 <= uVar5) {
            uVar24 = uVar15;
          }
          *(int *)((long)workSpace + (ulong)uVar17 * 8 + 8) =
               *(int *)((long)workSpace + (ulong)uVar24 * 8 + 8) +
               *(int *)((long)workSpace + (ulong)uVar7 * 8 + 8);
          *(ushort *)((long)workSpace + (ulong)uVar24 * 8 + 0xc) = uVar17;
          *(ushort *)((long)workSpace + (ulong)uVar7 * 8 + 0xc) = uVar17;
          uVar17 = uVar17 + 1;
        } while (uVar17 <= uVar13);
      }
      *(undefined1 *)((long)workSpace + (ulong)uVar13 * 8 + 0xf) = 0;
      if (uVar9 < 0xffffff00) {
        uVar22 = (ulong)(uVar18 + 0xff);
        do {
          uVar22 = uVar22 - 1;
          *(char *)((long)workSpace + uVar22 * 8 + 0x17) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar22 * 8 + 0x14) * 8 + 0xf) + '\x01';
        } while ((uVar22 & 0xffffff00) != 0);
      }
      uVar22 = 0xffffffffffffffff;
      do {
        *(char *)((long)workSpace + uVar22 * 8 + 0x17) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + uVar22 * 8 + 0x14) * 8 + 0xf) + '\x01';
        uVar22 = uVar22 + 1;
      } while (uVar22 < uVar19);
      bVar3 = *(byte *)((long)workSpace + uVar16 * 8 + 0xf);
      uVar13 = (uint)bVar3;
      uVar9 = (uint)bVar3;
      if (uVar8 <= uVar13 && uVar13 - uVar8 != 0) {
        bVar12 = (byte)(uVar13 - uVar8);
        pbVar26 = (byte *)((long)workSpace + uVar16 * 8 + 0xf);
        iVar21 = 0;
        uVar9 = uVar13;
        do {
          uVar20 = uVar18;
          iVar21 = (-1 << (bVar3 - (char)uVar9 & 0x1f)) + iVar21 + (1 << (bVar12 & 0x1f));
          *pbVar26 = (byte)uVar8;
          pbVar26 = (byte *)((long)workSpace + (ulong)uVar20 * 8 + 0xf);
          uVar9 = (uint)*pbVar26;
          uVar18 = uVar20 - 1;
        } while (uVar8 < *pbVar26);
        uVar16 = (ulong)(uVar20 + 1);
        do {
          uVar9 = (int)uVar16 - 1;
          uVar16 = (ulong)uVar9;
        } while (uVar8 == *(byte *)((long)workSpace + uVar16 * 8 + 0xf));
        uVar18 = iVar21 >> (bVar12 & 0x1f);
        local_118 = 0xf0f0f0f0f0f0f0f0;
        uStack_110 = 0xf0f0f0f0f0f0f0f0;
        uStack_108 = 0xf0f0f0f0f0f0f0f0;
        local_138._0_1_ = 0xf0;
        local_138._1_1_ = 0xf0;
        local_138._2_1_ = 0xf0;
        local_138._3_1_ = 0xf0;
        uStack_134._0_1_ = 0xf0;
        uStack_134._1_1_ = 0xf0;
        uStack_134._2_1_ = 0xf0;
        uStack_134._3_1_ = 0xf0;
        uStack_130 = 0xf0;
        uStack_12f = 0xf0;
        uStack_12e = 0xf0;
        uStack_12d = 0xf0;
        uStack_12c = 0xf0;
        uStack_12b = 0xf0;
        uStack_12a = 0xf0;
        uStack_129 = 0xf0;
        uStack_128 = 0xf0;
        uStack_127 = 0xf0;
        uStack_126 = 0xf0;
        uStack_125 = 0xf0;
        uStack_124 = 0xf0;
        uStack_123 = 0xf0;
        uStack_122 = 0xf0;
        uStack_121 = 0xf0;
        uStack_120 = 0xf0;
        uStack_11f = 0xf0;
        uStack_11e = 0xf0;
        uStack_11d = 0xf0;
        uStack_11c = 0xf0;
        uStack_11b = 0xf0;
        uStack_11a = 0xf0;
        uStack_119 = 0xf0;
        if (-1 < (int)uVar9) {
          pbVar26 = (byte *)((long)workSpace + uVar16 * 8 + 0xf);
          uVar20 = uVar8;
          do {
            if (*pbVar26 < uVar20) {
              uVar20 = (uint)*pbVar26;
              (&local_138)[uVar8 - uVar20] = uVar9;
            }
            pbVar26 = pbVar26 + -8;
            bVar28 = 0 < (int)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar28);
        }
        for (; 0 < (int)uVar18; uVar18 = (-1 << ((byte)uVar9 & 0x1f)) + uVar18) {
          uVar9 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar27 = (ulong)(0x20 - (uVar9 ^ 0x1f));
          uVar22 = uVar27;
          if ((uVar9 ^ 0x1f) != 0x1f) {
            do {
              uVar22 = uVar22 - 1;
              if (((ulong)(uint)(&uStack_134)[uVar22] != 0xf0f0f0f0) &&
                 (((&local_138)[uVar22 & 0xffffffff] == 0xf0f0f0f0 ||
                  (*(uint *)((long)workSpace + (ulong)(uint)(&uStack_134)[uVar22] * 8 + 8) <=
                   (uint)(*(int *)((long)workSpace +
                                  (ulong)(uint)(&local_138)[uVar22 & 0xffffffff] * 8 + 8) * 2)))))
              goto LAB_00110752;
              uVar27 = (ulong)((int)uVar27 - 1);
            } while ((uVar22 & 0xfffffffe) != 0);
            uVar27 = 1;
          }
LAB_00110752:
          if ((uint)uVar27 < 0xd) {
            do {
              if ((&local_138)[uVar27] != -0xf0f0f10) goto LAB_00110775;
              uVar27 = uVar27 + 1;
            } while (uVar27 != 0xd);
            uVar27 = 0xd;
          }
LAB_00110775:
          uVar9 = (int)uVar27 - 1;
          uVar22 = uVar27 & 0xffffffff;
          if ((&local_138)[uVar9] == -0xf0f0f10) {
            (&local_138)[uVar9] = (&local_138)[uVar22];
          }
          uVar20 = (&local_138)[uVar22];
          pcVar1 = (char *)((long)workSpace + (ulong)uVar20 * 8 + 0xf);
          *pcVar1 = *pcVar1 + '\x01';
          if ((ulong)uVar20 == 0) {
            uVar20 = 0xf0f0f0f0;
          }
          else {
            uVar20 = uVar20 - 1;
            (&local_138)[uVar22] = uVar20;
            if (uVar8 - (int)uVar27 != (uint)*(byte *)((long)workSpace + (ulong)uVar20 * 8 + 0xf)) {
              uVar20 = 0xf0f0f0f0;
            }
          }
          (&local_138)[uVar22] = uVar20;
        }
        uVar9 = uVar8;
        if ((int)uVar18 < 0) {
          uVar22 = (ulong)CONCAT13(uStack_134._3_1_,
                                   CONCAT12(uStack_134._2_1_,
                                            CONCAT11(uStack_134._1_1_,(undefined1)uStack_134)));
          do {
            uVar20 = 0xffffffff;
            if (-1 < (int)uVar18) {
              uVar20 = uVar18;
            }
            iVar21 = 0;
            while ((int)uVar22 + iVar21 != -0xf0f0f10) {
              pcVar1 = (char *)((long)workSpace + (ulong)(iVar21 + (int)uVar22 + 1) * 8 + 0xf);
              *pcVar1 = *pcVar1 + -1;
              iVar21 = iVar21 + 1;
              if (~uVar20 + uVar18 + iVar21 == 0) goto LAB_00110867;
            }
            iVar23 = uVar18 + iVar21;
            uVar22 = uVar16;
            do {
              uVar16 = uVar22;
              uVar22 = (ulong)((int)uVar16 - 1);
            } while (uVar8 == *(byte *)((long)workSpace + uVar16 * 8 + 0xf));
            uVar22 = (ulong)((int)uVar16 + 1);
            pcVar1 = (char *)((long)workSpace + uVar22 * 8 + 0xf);
            *pcVar1 = *pcVar1 + -1;
            uVar18 = uVar18 + iVar21 + 1;
          } while (iVar23 < -1);
        }
      }
LAB_00110867:
      uStack_128 = 0;
      uStack_127 = 0;
      uStack_126 = 0;
      uStack_125 = 0;
      uStack_124 = 0;
      uStack_123 = 0;
      uStack_122 = 0;
      uStack_121 = 0;
      uStack_120 = 0;
      uStack_11f = 0;
      local_138._0_1_ = 0;
      local_138._1_1_ = 0;
      local_138._2_1_ = 0;
      local_138._3_1_ = 0;
      uStack_134._0_1_ = 0;
      uStack_134._1_1_ = 0;
      uStack_134._2_1_ = 0;
      uStack_134._3_1_ = 0;
      uStack_130 = 0;
      uStack_12f = 0;
      uStack_12e = 0;
      uStack_12d = 0;
      uStack_12c = 0;
      uStack_12b = 0;
      uStack_12a = 0;
      uStack_129 = 0;
      Stack_148 = SUB1610((undefined1  [16])0x0,6);
      Stack_158 = SUB1610((undefined1  [16])0x0,0);
      local_14e = 0;
      if (uVar9 < 0xd) {
        uVar16 = 0xffffffffffffffff;
        do {
          psVar2 = (short *)((long)&local_138 +
                            (ulong)*(byte *)((long)workSpace + uVar16 * 8 + 0x17) * 2);
          *psVar2 = *psVar2 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar19);
        if (uVar9 != 0) {
          if (uVar8 < uVar13) {
            uVar13 = uVar8;
          }
          uVar16 = (ulong)(uVar13 * 2);
          uVar17 = 0;
          do {
            *(ushort *)((long)&Stack_158 + uVar16) = uVar17;
            uVar17 = (ushort)(uVar17 + *(short *)((long)&local_138 + uVar16)) >> 1;
            uVar16 = uVar16 - 2;
          } while ((int)uVar16 != 0);
        }
        uVar16 = 0;
        do {
          tree[*(byte *)((long)workSpace + uVar16 * 8 + 0xe)].nbBits =
               *(BYTE *)((long)workSpace + uVar16 * 8 + 0xf);
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
        uVar16 = 0;
        do {
          UVar4 = *(U16 *)((long)&Stack_158 + (ulong)tree[uVar16].nbBits * 2);
          *(U16 *)((long)&Stack_158 + (ulong)tree[uVar16].nbBits * 2) = UVar4 + 1;
          tree[uVar16].val = UVar4;
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      sVar11 = 0xffffffffffffffff;
      if (uVar9 < 0xd) {
        sVar11 = (ulong)uVar9;
      }
    }
  }
  return sVar11;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    nodeElt* const huffNode0 = (nodeElt*)workSpace;
    nodeElt* const huffNode = huffNode0+1;
    U32 n, nonNullRank;
    int lowS, lowN;
    U16 nodeNb = STARTNODE;
    U32 nodeRoot;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(huffNodeTable)) return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue);

    /* init for parents */
    nonNullRank = maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        U32 n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        U32 n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, nonNullRank, maxNbBits);

    /* fill result into tree (val, nbBits) */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
        U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
        if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */
        for (n=0; n<=nonNullRank; n++)
            nbPerRank[huffNode[n].nbBits]++;
        /* determine stating value per rank */
        {   U16 min = 0;
            for (n=maxNbBits; n>0; n--) {
                valPerRank[n] = min;      /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        for (n=0; n<=maxSymbolValue; n++)
            tree[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
        for (n=0; n<=maxSymbolValue; n++)
            tree[n].val = valPerRank[tree[n].nbBits]++;   /* assign value within rank, symbol order */
    }

    return maxNbBits;
}